

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmakecl.cpp
# Opt level: O2

char * make_opt_file_relative
                 (char *buf,size_t buflen,int read_opt_file,char *opt_file_path,char *fname)

{
  int iVar1;
  undefined4 in_register_00000014;
  char lcl [4096];
  char acStack_1018 [4096];
  
  if ((int)buflen != 0) {
    os_cvt_url_dir(buf,0x1000,opt_file_path);
    iVar1 = os_is_file_absolute(buf);
    opt_file_path = buf;
    if (iVar1 == 0) {
      lib_strcpy(acStack_1018,0x1000,buf);
      os_build_full_path(buf,0x1000,(char *)CONCAT44(in_register_00000014,read_opt_file),
                         acStack_1018);
    }
  }
  return opt_file_path;
}

Assistant:

static char *make_opt_file_relative(char *buf, size_t buflen,
                                    int read_opt_file,
                                    const char *opt_file_path,
                                    char *fname)
{
    /* 
     *   if we haven't read an option file, we don't have an option file path
     *   to use as the relative root, so use the original filename unchanged 
     */
    if (!read_opt_file)
        return fname;

    /* convert the name to local conventions */
    char lcl[OSFNMAX];
    os_cvt_url_dir(buf, buflen < sizeof(lcl) ? buflen : sizeof(lcl), fname);

    /* if the filename is absolute, use it as given */
    if (os_is_file_absolute(buf))
        return buf;

    /* 
     *   we have a relative filename and an option file, so build the given
     *   name relative to the option file path, using the version that we
     *   converted to local conventions 
     */
    lib_strcpy(lcl, sizeof(lcl), buf);
    os_build_full_path(buf, buflen, opt_file_path, lcl);

    /* return the caller's buffer where we built the full path */
    return buf;
}